

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_data_source__on_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  ma_channel *in_R8;
  size_t in_R9;
  ma_pcm_rb *pRB;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = *(undefined4 *)(in_RDI + 0x88);
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = *(undefined4 *)(in_RDI + 0x8c);
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = *(undefined4 *)(in_RDI + 0x90);
  }
  if (in_R8 != (ma_channel *)0x0) {
    ma_channel_map_init_standard
              ((ma_standard_channel_map)((ulong)in_RCX >> 0x20),in_R8,in_R9,
               (ma_uint32)((ulong)in_RDI >> 0x20));
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_pcm_rb_data_source__on_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_pcm_rb* pRB = (ma_pcm_rb*)pDataSource;
    MA_ASSERT(pRB != NULL);

    if (pFormat != NULL) {
        *pFormat = pRB->format;
    }

    if (pChannels != NULL) {
        *pChannels = pRB->channels;
    }

    if (pSampleRate != NULL) {
        *pSampleRate = pRB->sampleRate;
    }

    /* Just assume the default channel map. */
    if (pChannelMap != NULL) {
        ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pRB->channels);
    }

    return MA_SUCCESS;
}